

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::majorUpdateFtranParallel(HEkkDual *this)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  HVector *pHVar3;
  HVector_ptr pHVar4;
  HVector_ptr pHVar5;
  bool bVar6;
  HighsTask *pHVar7;
  HighsSplitDeque *pHVar8;
  HEkkDual *pHVar9;
  uint uVar10;
  HEkk *pHVar11;
  long *plVar12;
  ulong uVar13;
  HighsTimerClock *pHVar14;
  int iVar15;
  uint32_t uVar16;
  uint end;
  HVector_ptr *ppHVar17;
  HighsInt start;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  double dVar21;
  HVector_ptr multi_vector [17];
  double multi_density [17];
  TaskGroup local_170;
  anon_class_24_3_04dd5b7a local_160;
  HVector *local_148;
  long local_140 [17];
  double local_b8 [17];
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x45,0);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (this->analysis,7,(this->col_BFRT).count,(this->ekk_instance_->info_).col_aq_density);
  }
  pHVar11 = this->ekk_instance_;
  local_b8[0] = (pHVar11->info_).col_aq_density;
  local_148 = &this->col_BFRT;
  iVar15 = this->multi_nFinish;
  uVar18 = 1;
  if (this->edge_weight_mode == kSteepestEdge) {
    if (0 < iVar15) {
      ppHVar17 = &this->multi_finish[0].row_ep;
      uVar13 = 1;
      do {
        if (this->analysis->analyse_simplex_summary_data == true) {
          HighsSimplexAnalysis::operationRecordBefore
                    (this->analysis,8,(*ppHVar17)->count,(pHVar11->info_).row_DSE_density);
          pHVar11 = this->ekk_instance_;
          iVar15 = this->multi_nFinish;
        }
        local_b8[uVar13] = (pHVar11->info_).row_DSE_density;
        local_140[uVar13 - 1] = (long)*ppHVar17;
        uVar18 = uVar13 + 1;
        ppHVar17 = ppHVar17 + 0xf;
        bVar6 = (long)uVar13 < (long)iVar15;
        uVar13 = uVar18;
      } while (bVar6);
      goto LAB_00350239;
    }
  }
  else {
LAB_00350239:
    if (0 < iVar15) {
      ppHVar17 = &this->multi_finish[0].col_aq;
      lVar20 = 0;
      do {
        if (this->analysis->analyse_simplex_summary_data == true) {
          HighsSimplexAnalysis::operationRecordBefore
                    (this->analysis,6,(*ppHVar17)->count,(pHVar11->info_).col_aq_density);
          pHVar11 = this->ekk_instance_;
          iVar15 = this->multi_nFinish;
        }
        local_b8[(uVar18 & 0xffffffff) + lVar20] = (pHVar11->info_).col_aq_density;
        local_140[(uVar18 & 0xffffffff) + lVar20 + -1] = (long)*ppHVar17;
        lVar20 = lVar20 + 1;
        ppHVar17 = ppHVar17 + 0xf;
      } while (lVar20 < iVar15);
      uVar18 = (ulong)(uint)((int)uVar18 + (int)lVar20);
    }
    local_160.multi_vector = (HVector_ptr (*) [17])&local_148;
    local_160.multi_density = &local_b8;
    local_160.this = this;
    if (1 < (uint)uVar18) {
      HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
      plVar12 = (long *)__tls_get_addr(&PTR_00441ef0);
      local_170.workerDeque = (HighsSplitDeque *)*plVar12;
      local_170.dequeHead = ((local_170.workerDeque)->ownerData).head;
      do {
        pHVar8 = local_170.workerDeque;
        uVar19 = uVar18 >> 1 & 0x7fffffff;
        uVar10 = ((local_170.workerDeque)->ownerData).head;
        uVar13 = (ulong)uVar10;
        start = (HighsInt)uVar19;
        end = (uint)uVar18;
        if (uVar13 < 0x2000) {
          uVar16 = (uint32_t)(uVar13 + 1);
          ((local_170.workerDeque)->ownerData).head = uVar16;
          ((local_170.workerDeque)->taskArray)._M_elems[uVar13].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((local_170.workerDeque)->taskArray)._M_elems[uVar13].taskData =
               &PTR_operator___00441538;
          *(HighsInt *)(((local_170.workerDeque)->taskArray)._M_elems[uVar13].taskData + 8) = start;
          *(uint *)(((local_170.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0xc) = end;
          pHVar7 = ((local_170.workerDeque)->taskArray)._M_elems + uVar13;
          pHVar7->taskData[0x10] = '\x01';
          pHVar7->taskData[0x11] = '\0';
          pHVar7->taskData[0x12] = '\0';
          pHVar7->taskData[0x13] = '\0';
          *(anon_class_24_3_04dd5b7a **)
           (((local_170.workerDeque)->taskArray)._M_elems[uVar13].taskData + 0x18) = &local_160;
          if (((local_170.workerDeque)->ownerData).allStolenCopy == true) {
            ((local_170.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 uVar13 << 0x20 | uVar13 + 1;
            ((local_170.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((local_170.workerDeque)->ownerData).splitCopy = uVar16;
            ((local_170.workerDeque)->ownerData).allStolenCopy = false;
            if ((((local_170.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((local_170.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar2 = ((local_170.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            LOCK();
            _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
            (peVar2->haveJobs).super___atomic_base<int>._M_i =
                 (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var1._M_i < ((local_170.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((local_170.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_170.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(local_170.workerDeque);
          }
        }
        else {
          if ((((local_170.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((local_170.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(local_170.workerDeque);
            uVar10 = (pHVar8->ownerData).head;
          }
          (pHVar8->ownerData).head = uVar10 + 1;
          ::highs::parallel::for_each<HEkkDual::majorUpdateFtranParallel()::__0&>
                    (start,end,&local_160,1);
        }
        pHVar9 = local_160.this;
        uVar18 = uVar19;
      } while (3 < end);
      if (1 < end) {
        pHVar3 = (*local_160.multi_vector)[0];
        dVar21 = (*local_160.multi_density)[0];
        pHVar14 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer((local_160.this)->analysis)
        ;
        HSimplexNla::ftran(&pHVar9->ekk_instance_->simplex_nla_,pHVar3,dVar21,pHVar14);
      }
      ::highs::parallel::TaskGroup::taskWait(&local_170);
      ::highs::parallel::TaskGroup::~TaskGroup(&local_170);
      goto LAB_003504c8;
    }
    if ((uint)uVar18 != 1) goto LAB_003504c8;
  }
  dVar21 = local_b8[0];
  pHVar3 = local_148;
  pHVar14 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(this->analysis);
  HSimplexNla::ftran(&this->ekk_instance_->simplex_nla_,pHVar3,dVar21,pHVar14);
LAB_003504c8:
  iVar15 = this->multi_nFinish;
  if (0 < (long)iVar15) {
    dVar21 = this->ekk_instance_->total_synthetic_tick_;
    lVar20 = 0;
    do {
      dVar21 = dVar21 + *(double *)(*(long *)((long)&this->multi_finish[0].col_aq + lVar20) + 0x38)
               + *(double *)(*(long *)((long)&this->multi_finish[0].row_ep + lVar20) + 0x38);
      lVar20 = lVar20 + 0x78;
    } while ((long)iVar15 * 0x78 - lVar20 != 0);
    this->ekk_instance_->total_synthetic_tick_ = dVar21;
  }
  if (this->analysis->analyse_simplex_summary_data != false) {
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,7,(this->col_BFRT).count);
    iVar15 = this->multi_nFinish;
  }
  if (0 < iVar15) {
    ppHVar17 = &this->multi_finish[0].col_aq;
    lVar20 = 0;
    do {
      pHVar4 = *ppHVar17;
      pHVar5 = ppHVar17[-1];
      HEkk::updateOperationResultDensity
                (this->ekk_instance_,(double)pHVar4->count / (double)this->solver_num_row,
                 &(this->ekk_instance_->info_).col_aq_density);
      if (this->analysis->analyse_simplex_summary_data == true) {
        HighsSimplexAnalysis::operationRecordAfter(this->analysis,6,pHVar4->count);
      }
      if (this->edge_weight_mode == kSteepestEdge) {
        HEkk::updateOperationResultDensity
                  (this->ekk_instance_,(double)pHVar5->count / (double)this->solver_num_row,
                   &(this->ekk_instance_->info_).row_DSE_density);
        if (this->analysis->analyse_simplex_summary_data == true) {
          HighsSimplexAnalysis::operationRecordAfter(this->analysis,8,pHVar5->count);
        }
      }
      lVar20 = lVar20 + 1;
      ppHVar17 = ppHVar17 + 0xf;
    } while (lVar20 < this->multi_nFinish);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x45,0);
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranParallel() {
  analysis->simplexTimerStart(FtranMixParClock);

  // Prepare buffers
  HighsInt multi_ntasks = 0;
  double multi_density[kSimplexConcurrencyLimit * 2 + 1];
  HVector_ptr multi_vector[kSimplexConcurrencyLimit * 2 + 1];
  // BFRT first
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtranBfrt, col_BFRT.count,
                                    ekk_instance_.info_.col_aq_density);
  multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
  multi_vector[multi_ntasks] = &col_BFRT;
  multi_ntasks++;
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    // Then DSE
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordBefore(kSimplexNlaFtranDse,
                                        multi_finish[iFn].row_ep->count,
                                        ekk_instance_.info_.row_DSE_density);
      multi_density[multi_ntasks] = ekk_instance_.info_.row_DSE_density;
      multi_vector[multi_ntasks] = multi_finish[iFn].row_ep;
      multi_ntasks++;
    }
  }
  // Then Column
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordBefore(kSimplexNlaFtran,
                                      multi_finish[iFn].col_aq->count,
                                      ekk_instance_.info_.col_aq_density);
    multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
    multi_vector[multi_ntasks] = multi_finish[iFn].col_aq;
    multi_ntasks++;
  }

  // Perform FTRAN
  // #pragma omp parallel for schedule(dynamic, 1)
  // printf("majorUpdateFtranParallel: starting %d tasks\n", multi_ntasks);
  highs::parallel::for_each(0, multi_ntasks, [&](HighsInt start, HighsInt end) {
    for (HighsInt i = start; i < end; i++) {
      HVector_ptr rhs = multi_vector[i];
      double density = multi_density[i];
      HighsTimerClock* factor_timer_clock_pointer =
          analysis->getThreadFactorTimerClockPointer();
      ekk_instance_.simplex_nla_.ftran(*rhs, density,
                                       factor_timer_clock_pointer);
    }
  });

  // Update ticks
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    ekk_instance_.total_synthetic_tick_ += Col->synthetic_tick;
    ekk_instance_.total_synthetic_tick_ += Row->synthetic_tick;
  }

  // Update rates
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtranBfrt, col_BFRT.count);
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    const double local_col_aq_density = (double)Col->count / solver_num_row;
    ekk_instance_.updateOperationResultDensity(
        local_col_aq_density, ekk_instance_.info_.col_aq_density);
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordAfter(kSimplexNlaFtran, Col->count);
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      const double local_row_DSE_density = (double)Row->count / solver_num_row;
      ekk_instance_.updateOperationResultDensity(
          local_row_DSE_density, ekk_instance_.info_.row_DSE_density);
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordAfter(kSimplexNlaFtranDse, Row->count);
    }
  }
  analysis->simplexTimerStop(FtranMixParClock);
}